

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O3

Status * __thiscall
draco::PointCloudDecoder::DecodeStep2(Status *__return_storage_ptr__,PointCloudDecoder *this)

{
  int iVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  iVar1 = (*this->_vptr_PointCloudDecoder[7])(this);
  if ((char)iVar1 == '\0') {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Failed to decode point attributes.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_38,local_30 + (long)local_38);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  else {
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudDecoder::DecodeStep2() {
  if (!DecodePointAttributesStep2()) {
    return Status(Status::DRACO_ERROR, "Failed to decode point attributes.");
  }
  return OkStatus();
}